

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

bool __thiscall
ON_RenderContentPrivate::SetChild
          (ON_RenderContentPrivate *this,ON_RenderContent *child,wchar_t *child_slot_name)

{
  recursive_mutex *__mutex;
  ON_RenderContentPrivate *this_00;
  bool bVar1;
  int iVar2;
  ON_RenderContent *old_child;
  ON_XMLVariant OStack_128;
  
  __mutex = &this->m_mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (child != (ON_RenderContent *)0x0) {
    this_00 = child->_private;
    if (this_00->m_model == (ONX_Model *)0x0) {
      bVar1 = false;
      if ((child_slot_name == (wchar_t *)0x0) || (this_00->m_parent != (ON_RenderContent *)0x0))
      goto LAB_00598ffe;
      if (*child_slot_name != L'\0') {
        ::ON_XMLVariant::ON_XMLVariant(&OStack_128,child_slot_name);
        SetPropertyValue(this_00,L"child-slot-name",&OStack_128);
        ::ON_XMLVariant::~ON_XMLVariant(&OStack_128);
        goto LAB_00598f84;
      }
    }
LAB_00598f38:
    bVar1 = false;
    goto LAB_00598ffe;
  }
LAB_00598f84:
  old_child = FindChild(this,child_slot_name);
  if (old_child == (ON_RenderContent *)0x0) {
    if (child != (ON_RenderContent *)0x0) {
      bVar1 = AddChild(this,child);
      if (!bVar1) goto LAB_00598f38;
      goto LAB_00598fd2;
    }
  }
  else {
    bVar1 = ChangeChild(this,old_child,child);
    if (child == (ON_RenderContent *)0x0 || !bVar1) goto LAB_00598ffe;
LAB_00598fd2:
    for (; this->m_parent != (ON_RenderContent *)0x0; this = this->m_parent->_private) {
    }
    child->_private->m_model = this->m_render_content->_private->m_model;
  }
  bVar1 = true;
LAB_00598ffe:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return bVar1;
}

Assistant:

bool ON_RenderContentPrivate::SetChild(ON_RenderContent* child, const wchar_t* child_slot_name)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  if (nullptr != child)
  {
    if (nullptr != child->_private->m_model)
      return false;

    if (nullptr != child->_private->m_parent)
      return false;

    if ((nullptr == child_slot_name) || (0 == child_slot_name[0]))
      return false;

    child->_private->SetPropertyValue(ON_RENDER_CONTENT_CHILD_SLOT_NAME, child_slot_name);
  }

  // Get any existing child with the same child slot name (may be null).
  auto* existing_child = FindChild(child_slot_name);
  if (nullptr != existing_child)
  {
    // There is an existing child with the same child slot name; replace it.
    if (!ChangeChild(existing_child, child)) // Deletes existing_child.
      return false;
  }
  else
  {
    // No existing child; just add the new one.
    if (nullptr != child)
    {
      if (!AddChild(*child))
        return false;
    }
  }

  if (nullptr != child)
  {
    auto* pModel = TopLevel()._private->m_model;
    child->_private->m_model = pModel;
  }

  return true;
}